

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_opn.cpp
# Opt level: O0

void __thiscall ymfm::ym2608::write_data_hi(ym2608 *this,uint8_t data)

{
  uint32_t uVar1;
  ymfm_interface *pyVar2;
  size_t in_RCX;
  uint8_t data_local;
  ym2608 *this_local;
  
  uVar1 = bitfield((uint)this->m_address,8,1);
  if (uVar1 != 0) {
    if (this->m_address < 0x110) {
      adpcm_b_engine::write(&this->m_adpcm_b,this->m_address & 0xf,(void *)(ulong)data,in_RCX);
    }
    else if (this->m_address == 0x110) {
      uVar1 = bitfield((uint)data,7,1);
      if (uVar1 == 0) {
        this->m_flag_control = data;
        fm_engine_base<ymfm::opn_registers_base<true>_>::set_irq_mask
                  ((fm_engine_base<ymfm::opn_registers_base<true>_> *)&this->m_fm,
                   this->m_irq_enable & (this->m_flag_control ^ 0xff) & 0x1f);
      }
      else {
        fm_engine_base<ymfm::opn_registers_base<true>_>::set_reset_status
                  ((fm_engine_base<ymfm::opn_registers_base<true>_> *)&this->m_fm,'\0',0xff);
      }
    }
    else {
      fm_engine_base<ymfm::opn_registers_base<true>_>::write
                ((fm_engine_base<ymfm::opn_registers_base<true>_> *)&this->m_fm,
                 (uint)this->m_address,(void *)(ulong)data,in_RCX);
    }
    pyVar2 = fm_engine_base<ymfm::opn_registers_base<true>_>::intf
                       ((fm_engine_base<ymfm::opn_registers_base<true>_> *)&this->m_fm);
    uVar1 = fm_engine_base<ymfm::opn_registers_base<true>_>::clock_prescale
                      ((fm_engine_base<ymfm::opn_registers_base<true>_> *)&this->m_fm);
    (*(code *)pyVar2->m_engine[3]._vptr_ymfm_engine_callbacks)(pyVar2,uVar1 << 5);
  }
  return;
}

Assistant:

void ym2608::write_data_hi(uint8_t data)
{
	// ignore if paired with upper address
	if (!bitfield(m_address, 8))
		return;

	if (m_address < 0x110)
	{
		// 100-10F: write to ADPCM-B
		m_adpcm_b.write(m_address & 0x0f, data);
	}
	else if (m_address == 0x110)
	{
		// 110: IRQ flag control
		if (bitfield(data, 7))
			m_fm.set_reset_status(0, 0xff);
		else
		{
			m_flag_control = data;
			m_fm.set_irq_mask(m_irq_enable & ~m_flag_control & 0x1f);
		}
	}
	else
	{
		// 111-1FF: write to FM
		m_fm.write(m_address, data);
	}

	// mark busy for a bit
	m_fm.intf().ymfm_set_busy_end(32 * m_fm.clock_prescale());
}